

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArrayBase::ValidateIndexAndDirectSetItem
          (TypedArrayBase *this,Var index,Var value,bool *isNumericIndex)

{
  uint32 uVar1;
  int local_44;
  bool local_31;
  uint32 indexToSet;
  bool skipSetItem;
  bool *isNumericIndex_local;
  Var value_local;
  Var index_local;
  TypedArrayBase *this_local;
  
  local_31 = false;
  _indexToSet = isNumericIndex;
  isNumericIndex_local = (bool *)value;
  value_local = index;
  index_local = this;
  uVar1 = ValidateAndReturnIndex(this,index,&local_31,isNumericIndex);
  if ((*_indexToSet & 1U) == 0) {
    this_local._4_4_ = 1;
  }
  else {
    if ((local_31 & 1U) == 0) {
      local_44 = (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                   super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x70])(this,(ulong)uVar1,isNumericIndex_local);
    }
    else {
      local_44 = (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                   super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x71])(this,(ulong)uVar1,isNumericIndex_local);
    }
    this_local._4_4_ = local_44;
  }
  return this_local._4_4_;
}

Assistant:

_Use_decl_annotations_ BOOL TypedArrayBase::ValidateIndexAndDirectSetItem(Js::Var index, Js::Var value, bool * isNumericIndex)
    {
        bool skipSetItem = false;
        uint32 indexToSet = ValidateAndReturnIndex(index, &skipSetItem, isNumericIndex);

        // If index is not numeric, goto [[Set]] property path
        if (*isNumericIndex)
        {
            return skipSetItem ?
                DirectSetItemNoSet(indexToSet, value) :
                DirectSetItem(indexToSet, value);
        }
        else
        {
            return TRUE;
        }
    }